

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  ushort uVar1;
  int iVar2;
  pollfd *__fds;
  int *piVar3;
  ulong uVar4;
  undefined8 uVar5;
  int iVar6;
  nfds_t __nfds;
  bool bVar7;
  int fd;
  size_t sz;
  int local_34;
  
  __fds = (pollfd *)nn_alloc_((long)nfds << 4);
  if (__fds == (pollfd *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/poll.c",
            0x8c);
  }
  else {
    uVar4 = 0;
    iVar6 = 0;
    local_34 = timeout;
    while( true ) {
      __nfds = (nfds_t)iVar6;
      if ((uint)nfds == uVar4) {
        iVar6 = poll(__fds,__nfds,local_34);
        if (iVar6 < 1) {
          piVar3 = __errno_location();
          iVar2 = *piVar3;
          nn_free(__fds);
          *piVar3 = iVar2;
        }
        else {
          iVar2 = 0;
          iVar6 = 0;
          for (uVar4 = 0; (uint)nfds != uVar4; uVar4 = uVar4 + 1) {
            fds[uVar4].revents = 0;
            if ((fds[uVar4].events & 1U) == 0) {
              uVar1 = 0;
            }
            else {
              bVar7 = (__fds[iVar2].revents & 1) != 0;
              if (bVar7) {
                fds[uVar4].revents = 1;
              }
              uVar1 = (ushort)bVar7;
              iVar2 = iVar2 + 1;
            }
            if ((fds[uVar4].events & 2U) != 0) {
              if ((__fds[iVar2].revents & 1) != 0) {
                uVar1 = uVar1 | 2;
                fds[uVar4].revents = uVar1;
              }
              iVar2 = iVar2 + 1;
            }
            iVar6 = (iVar6 + 1) - (uint)(uVar1 == 0);
          }
          nn_free(__fds);
        }
        return iVar6;
      }
      uVar1 = fds[uVar4].events;
      if ((uVar1 & 1) != 0) break;
LAB_00110cce:
      if ((uVar1 & 2) != 0) {
        sz = 4;
        iVar2 = nn_getsockopt(fds[uVar4].fd,0,10,&fd,&sz);
        if (iVar2 < 0) {
LAB_00110dbd:
          nn_free(__fds);
          return -1;
        }
        if (sz != 4) {
          nn_backtrace_print();
          uVar5 = 0xa2;
          goto LAB_00110e20;
        }
        __fds[iVar6].fd = fd;
        __fds[iVar6].events = 1;
        iVar6 = iVar6 + 1;
      }
      uVar4 = uVar4 + 1;
    }
    sz = 4;
    iVar2 = nn_getsockopt(fds[uVar4].fd,0,0xb,&fd,&sz);
    if (iVar2 < 0) goto LAB_00110dbd;
    if (sz == 4) {
      __fds[__nfds].fd = fd;
      __fds[__nfds].events = 1;
      iVar6 = iVar6 + 1;
      uVar1 = fds[uVar4].events;
      goto LAB_00110cce;
    }
    nn_backtrace_print();
    uVar5 = 0x96;
LAB_00110e20:
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (fd)",
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/src/core/poll.c",
            uVar5);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}